

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnImportGlobal
          (BinaryReaderObjdumpPrepass *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  string_view local_d0;
  string_view local_c0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string_view local_50;
  
  local_d0.size_ = field_name.size_;
  local_d0.data_ = field_name.data_;
  local_c0.size_ = module_name.size_;
  local_c0.data_ = module_name.data_;
  string_view::to_string_abi_cxx11_(&local_90,&local_c0);
  std::operator+(&local_70,&local_90,".");
  string_view::to_string_abi_cxx11_(&local_b0,&local_d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                 &local_70,&local_b0);
  SetGlobalName(this,global_index,local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Result)Ok;
}

Assistant:

Result OnImportGlobal(Index import_index,
                        string_view module_name,
                        string_view field_name,
                        Index global_index,
                        Type type,
                        bool mutable_) override {
    SetGlobalName(global_index,
                  module_name.to_string() + "." + field_name.to_string());
    return Result::Ok;
  }